

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O2

ostream * operator<<(ostream *os,OracleVal *o)

{
  ostream *poVar1;
  string local_30 [32];
  
  poVar1 = std::operator<<(os,"[oracle:");
  lest::to_string_abi_cxx11_(0);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream & operator<<( std::ostream & os, OracleVal const & o )
{
    using lest::to_string;
    return os << "[oracle:" << to_string( o.i ) << "]";
}